

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O2

void wide_bit_sum(RK_U8 *data,RK_U32 len,RK_ULONG *sum)

{
  ulong uVar1;
  
  for (uVar1 = 0; len >> 2 != uVar1; uVar1 = uVar1 + 1) {
    *sum = *sum + (ulong)*(uint *)(data + uVar1 * 4);
  }
  for (uVar1 = (ulong)((len >> 2) << 2); uVar1 < len; uVar1 = uVar1 + 1) {
    *sum = *sum + (ulong)data[uVar1];
  }
  return;
}

Assistant:

void wide_bit_sum(RK_U8 *data, RK_U32 len, RK_ULONG *sum)
{
    RK_U8   *data8 = NULL;
    RK_U32  loop;
    data8 = data;
#if LONG_MAX == INT_MAX
    RK_U16 *data_rk = NULL;
    data_rk = (RK_U16 *)data;
#else
    RK_U32 *data_rk = NULL;
    data_rk = (RK_U32 *)data;
#endif

    for (loop = 0; loop < len / CAL_BYTE; loop++) {
        *sum += data_rk[loop];
    }
    for (loop = len / CAL_BYTE * CAL_BYTE; loop < len; loop++) {
        *sum += data8[loop];
    }

    return;
}